

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O2

int Ssc_ManCheckEquivalence(Ssc_Man_t *p,int iRepr,int iNode,int fCompl)

{
  sat_solver *s;
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  long lVar4;
  abctime *paVar5;
  int pLitsSat [2];
  
  if (iRepr == iNode) {
    __assert_fail("iRepr != iNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscSat.c"
                  ,0x160,"int Ssc_ManCheckEquivalence(Ssc_Man_t *, int, int, int)");
  }
  if (iNode < iRepr) {
    return 0;
  }
  if (iNode <= iRepr) {
    __assert_fail("iRepr < iNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscSat.c"
                  ,0x163,"int Ssc_ManCheckEquivalence(Ssc_Man_t *, int, int, int)");
  }
  if (iRepr != 0) {
    Ssc_ManCnfNodeAddToSolver(p,iRepr);
  }
  Ssc_ManCnfNodeAddToSolver(p,iNode);
  s = p->pSat;
  if ((s->qtail != s->qhead) && (iVar1 = sat_solver_simplify(s), iVar1 == 0)) {
    __assert_fail("RetValue != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver.h"
                  ,0xe1,"void sat_solver_compress(sat_solver *)");
  }
  iVar1 = Ssc_ObjSatVar(p,iRepr);
  pLitsSat[0] = Abc_Var2Lit(iVar1,0);
  iVar1 = Ssc_ObjSatVar(p,iNode);
  pLitsSat[1] = Abc_Var2Lit(iVar1,(uint)(0 < iRepr) ^ fCompl);
  aVar2 = Abc_Clock();
  iVar1 = sat_solver_solve(p->pSat,pLitsSat,(lit *)&stack0xffffffffffffffd8,(long)p->pPars->nBTLimit
                           ,0,0,0);
  if (iVar1 == 1) {
LAB_004ab218:
    Ssc_ManCollectSatPattern(p,p->vPattern);
    aVar3 = Abc_Clock();
    lVar4 = aVar3 - aVar2;
    paVar5 = &p->timeSatSat;
    iVar1 = 1;
  }
  else {
    if (iVar1 == -1) {
      pLitsSat[0] = Abc_LitNot(pLitsSat[0]);
      pLitsSat[1] = Abc_LitNot(pLitsSat[1]);
      iVar1 = sat_solver_addclause(p->pSat,pLitsSat,(lit *)&stack0xffffffffffffffd8);
      if (iVar1 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscSat.c"
                      ,0x17a,"int Ssc_ManCheckEquivalence(Ssc_Man_t *, int, int, int)");
      }
      aVar3 = Abc_Clock();
      p->timeSatUnsat = p->timeSatUnsat + (aVar3 - aVar2);
      if (iRepr == 0) {
        return -1;
      }
      aVar2 = Abc_Clock();
      iVar1 = sat_solver_solve(p->pSat,pLitsSat,(lit *)&stack0xffffffffffffffd8,
                               (long)p->pPars->nBTLimit,0,0,0);
      if (iVar1 == 1) goto LAB_004ab218;
      if (iVar1 == -1) {
        pLitsSat[0] = Abc_LitNot(pLitsSat[0]);
        pLitsSat[1] = Abc_LitNot(pLitsSat[1]);
        iVar1 = sat_solver_addclause(p->pSat,pLitsSat,(lit *)&stack0xffffffffffffffd8);
        if (iVar1 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssc/sscSat.c"
                        ,0x196,"int Ssc_ManCheckEquivalence(Ssc_Man_t *, int, int, int)");
        }
        paVar5 = &p->timeSatUnsat;
        aVar3 = Abc_Clock();
        lVar4 = aVar3 - aVar2;
        iVar1 = -1;
        goto LAB_004ab249;
      }
    }
    aVar3 = Abc_Clock();
    lVar4 = aVar3 - aVar2;
    paVar5 = &p->timeSatUndec;
    iVar1 = 0;
  }
LAB_004ab249:
  *paVar5 = *paVar5 + lVar4;
  return iVar1;
}

Assistant:

int Ssc_ManCheckEquivalence( Ssc_Man_t * p, int iRepr, int iNode, int fCompl )
{
    int pLitsSat[2], RetValue;
    abctime clk;
    assert( iRepr != iNode );
    if ( iRepr > iNode )
        return l_Undef;
    assert( iRepr < iNode );
//    if ( p->nTimeOut )
//        sat_solver_set_runtime_limit( p->pSat, p->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() );

    // create CNF
    if ( iRepr )
    Ssc_ManCnfNodeAddToSolver( p, iRepr );
    Ssc_ManCnfNodeAddToSolver( p, iNode );
    sat_solver_compress( p->pSat );

    // order the literals
    pLitsSat[0] = Abc_Var2Lit( Ssc_ObjSatVar(p, iRepr), 0 );
    pLitsSat[1] = Abc_Var2Lit( Ssc_ObjSatVar(p, iNode), fCompl ^ (int)(iRepr > 0) );

    // solve under assumptions
    // A = 1; B = 0
    clk = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, pLitsSat, pLitsSat + 2, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_False )
    {
        pLitsSat[0] = Abc_LitNot( pLitsSat[0] ); // compl
        pLitsSat[1] = Abc_LitNot( pLitsSat[1] ); // compl
        RetValue = sat_solver_addclause( p->pSat, pLitsSat, pLitsSat + 2 );
        assert( RetValue );
        p->timeSatUnsat += Abc_Clock() - clk;
    }
    else if ( RetValue == l_True )
    {
        Ssc_ManCollectSatPattern( p, p->vPattern );
        p->timeSatSat += Abc_Clock() - clk;
        return l_True;
    }
    else // if ( RetValue1 == l_Undef )
    {
        p->timeSatUndec += Abc_Clock() - clk;
        return l_Undef;
    }

    // if the old node was constant 0, we already know the answer
    if ( iRepr == 0 )
        return l_False;

    // solve under assumptions
    // A = 0; B = 1
    clk = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, pLitsSat, pLitsSat + 2, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_False )
    {
        pLitsSat[0] = Abc_LitNot( pLitsSat[0] );
        pLitsSat[1] = Abc_LitNot( pLitsSat[1] );
        RetValue = sat_solver_addclause( p->pSat, pLitsSat, pLitsSat + 2 );
        assert( RetValue );
        p->timeSatUnsat += Abc_Clock() - clk;
    }
    else if ( RetValue == l_True )
    {
        Ssc_ManCollectSatPattern( p, p->vPattern );
        p->timeSatSat += Abc_Clock() - clk;
        return l_True;
    }
    else // if ( RetValue1 == l_Undef )
    {
        p->timeSatUndec += Abc_Clock() - clk;
        return l_Undef;
    }
    return l_False;
}